

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[5],kj::String,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [5],String *params_1,
          char (*params_2) [3])

{
  char (*value) [5];
  String *str;
  char (*value_00) [3];
  ArrayPtr<const_char> local_80;
  StringTree local_70;
  ArrayPtr<const_char> local_38;
  String *local_28;
  char (*params_local_2) [3];
  String *params_local_1;
  char (*params_local) [5];
  
  local_28 = params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (String *)this;
  params_local = (char (*) [5])__return_storage_ptr__;
  value = ::const((char (*) [5])this);
  local_38 = _::toStringTreeOrCharSequence<char_const(&)[5]>(value);
  str = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  _::toStringTreeOrCharSequence(&local_70,str);
  value_00 = ::const((char (*) [3])local_28);
  local_80 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value_00);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,(ArrayPtr<const_char> *)&local_70,
             (StringTree *)&local_80,(ArrayPtr<const_char> *)params_2);
  StringTree::~StringTree(&local_70);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}